

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

CLibrary * clib_new(lua_State *L,GCtab *mt)

{
  undefined4 *puVar1;
  lua_State *L_00;
  GCudata *pGVar2;
  uint32_t in_ESI;
  long in_RDI;
  CLibrary *cl;
  GCudata *ud;
  GCtab *t;
  GCtab *in_stack_ffffffffffffffa0;
  lua_State *in_stack_ffffffffffffffa8;
  
  L_00 = (lua_State *)
         lj_tab_new(in_stack_ffffffffffffffa8,(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                    (uint32_t)in_stack_ffffffffffffffa0);
  pGVar2 = lj_udata_new(L_00,(MSize)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        in_stack_ffffffffffffffa0);
  *(lua_State **)&pGVar2[1].env = L_00;
  pGVar2->udtype = '\x02';
  (pGVar2->metatable).gcptr32 = in_ESI;
  puVar1 = *(undefined4 **)(in_RDI + 0x18);
  *(undefined4 **)(in_RDI + 0x18) = puVar1 + 2;
  *puVar1 = (int)pGVar2;
  puVar1[1] = 0xfffffff3;
  return (CLibrary *)(pGVar2 + 1);
}

Assistant:

static CLibrary *clib_new(lua_State *L, GCtab *mt)
{
  GCtab *t = lj_tab_new(L, 0, 0);
  GCudata *ud = lj_udata_new(L, sizeof(CLibrary), t);
  CLibrary *cl = (CLibrary *)uddata(ud);
  cl->cache = t;
  ud->udtype = UDTYPE_FFI_CLIB;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcref(ud->metatable, obj2gco(mt));
  setudataV(L, L->top++, ud);
  return cl;
}